

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed)

{
  Nonnull<const_char_*> failure_msg;
  int line;
  ExtensionInfo info;
  FieldType local_59;
  ExtensionInfo local_58;
  
  local_58.message._0_4_ = 0xe;
  local_59 = type;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<unsigned_char,google::protobuf::internal::WireFormatLite::FieldType>
                          (&local_59,(FieldType *)&local_58,"type != WireFormatLite::TYPE_ENUM");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_58.message._0_4_ = 0xb;
    local_59 = type;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_NEImpl<unsigned_char,google::protobuf::internal::WireFormatLite::FieldType>
                            (&local_59,(FieldType *)&local_58,"type != WireFormatLite::TYPE_MESSAGE"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_58.message._0_4_ = 10;
      local_59 = type;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_NEImpl<unsigned_char,google::protobuf::internal::WireFormatLite::FieldType>
                              (&local_59,(FieldType *)&local_58,"type != WireFormatLite::TYPE_GROUP"
                              );
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        local_58._15_8_ = 0;
        local_58.field_6._7_8_ = 0;
        local_58._31_8_ = 0;
        local_58._39_8_ = 0;
        local_58.lazy_eager_verify_func._7_1_ = 0;
        local_58.message = extendee;
        local_58.number = number;
        local_58.type = type;
        local_58.is_repeated = is_repeated;
        local_58.is_packed = is_packed;
        anon_unknown_59::Register(&local_58);
        return;
      }
      line = 0x8c;
    }
    else {
      line = 0x8b;
    }
  }
  else {
    line = 0x8a;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* extendee, int number,
                                     FieldType type, bool is_repeated,
                                     bool is_packed) {
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  Register(info);
}